

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestUnpackedTypes::_InternalSerialize
          (TestUnpackedTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_int> *pRVar2;
  RepeatedField<unsigned_long> *pRVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<float> *this_00;
  RepeatedField<double> *this_01;
  RepeatedField<bool> *this_02;
  ulong uVar5;
  int iVar6;
  uint8_t *puVar7;
  const_reference piVar8;
  const_reference plVar9;
  const_reference puVar10;
  const_reference puVar11;
  const_reference pfVar12;
  const_reference pdVar13;
  const_reference pbVar14;
  int iVar15;
  
  iVar6 = google::protobuf::RepeatedField<int>::size(&(this->field_0)._impl_.unpacked_int32_);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar8 = google::protobuf::RepeatedField<int>::Get
                       (&(this->field_0)._impl_.unpacked_int32_,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x5a,*piVar8,puVar7);
  }
  pRVar1 = &(this->field_0)._impl_.unpacked_int64_;
  iVar6 = google::protobuf::RepeatedField<long>::size(pRVar1);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    plVar9 = google::protobuf::RepeatedField<long>::Get(pRVar1,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArray(0x5b,*plVar9,puVar7);
  }
  pRVar2 = &(this->field_0)._impl_.unpacked_uint32_;
  iVar6 = google::protobuf::RepeatedField<unsigned_int>::size(pRVar2);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar10 = google::protobuf::RepeatedField<unsigned_int>::Get(pRVar2,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0x5c,*puVar10,puVar7);
  }
  pRVar3 = &(this->field_0)._impl_.unpacked_uint64_;
  iVar6 = google::protobuf::RepeatedField<unsigned_long>::size(pRVar3);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar11 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar3,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(0x5d,*puVar11,puVar7);
  }
  pRVar4 = &(this->field_0)._impl_.unpacked_sint32_;
  iVar6 = google::protobuf::RepeatedField<int>::size(pRVar4);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar8 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteSInt32ToArray(0x5e,*piVar8,puVar7);
  }
  pRVar1 = &(this->field_0)._impl_.unpacked_sint64_;
  iVar6 = google::protobuf::RepeatedField<long>::size(pRVar1);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    plVar9 = google::protobuf::RepeatedField<long>::Get(pRVar1,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteSInt64ToArray(0x5f,*plVar9,puVar7);
  }
  pRVar2 = &(this->field_0)._impl_.unpacked_fixed32_;
  iVar6 = google::protobuf::RepeatedField<unsigned_int>::size(pRVar2);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar10 = google::protobuf::RepeatedField<unsigned_int>::Get(pRVar2,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteFixed32ToArray(0x60,*puVar10,puVar7);
  }
  pRVar3 = &(this->field_0)._impl_.unpacked_fixed64_;
  iVar6 = google::protobuf::RepeatedField<unsigned_long>::size(pRVar3);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar11 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar3,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteFixed64ToArray(0x61,*puVar11,puVar7);
  }
  pRVar4 = &(this->field_0)._impl_.unpacked_sfixed32_;
  iVar6 = google::protobuf::RepeatedField<int>::size(pRVar4);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar8 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteSFixed32ToArray(0x62,*piVar8,puVar7);
  }
  pRVar1 = &(this->field_0)._impl_.unpacked_sfixed64_;
  iVar6 = google::protobuf::RepeatedField<long>::size(pRVar1);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    plVar9 = google::protobuf::RepeatedField<long>::Get(pRVar1,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteSFixed64ToArray(99,*plVar9,puVar7);
  }
  this_00 = &(this->field_0)._impl_.unpacked_float_;
  iVar6 = google::protobuf::RepeatedField<float>::size(this_00);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pfVar12 = google::protobuf::RepeatedField<float>::Get(this_00,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(100,*pfVar12,puVar7);
  }
  this_01 = &(this->field_0)._impl_.unpacked_double_;
  iVar6 = google::protobuf::RepeatedField<double>::size(this_01);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pdVar13 = google::protobuf::RepeatedField<double>::Get(this_01,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteDoubleToArray(0x65,*pdVar13,puVar7);
  }
  this_02 = &(this->field_0)._impl_.unpacked_bool_;
  iVar6 = google::protobuf::RepeatedField<bool>::size(this_02);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pbVar14 = google::protobuf::RepeatedField<bool>::Get(this_02,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0x66,*pbVar14,puVar7);
  }
  pRVar4 = &(this->field_0)._impl_.unpacked_enum_;
  iVar6 = google::protobuf::RepeatedField<int>::size(pRVar4);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar8 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(0x67,*piVar8,puVar7);
  }
  uVar5 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    puVar7 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar5 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar7;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestUnpackedTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestUnpackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestUnpackedTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 unpacked_int32 = 90 [features = {
  for (int i = 0, n = this_._internal_unpacked_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        90, this_._internal_unpacked_int32().Get(i), target);
  }

  // repeated int64 unpacked_int64 = 91 [features = {
  for (int i = 0, n = this_._internal_unpacked_int64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt64ToArray(
        91, this_._internal_unpacked_int64().Get(i), target);
  }

  // repeated uint32 unpacked_uint32 = 92 [features = {
  for (int i = 0, n = this_._internal_unpacked_uint32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        92, this_._internal_unpacked_uint32().Get(i), target);
  }

  // repeated uint64 unpacked_uint64 = 93 [features = {
  for (int i = 0, n = this_._internal_unpacked_uint64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        93, this_._internal_unpacked_uint64().Get(i), target);
  }

  // repeated sint32 unpacked_sint32 = 94 [features = {
  for (int i = 0, n = this_._internal_unpacked_sint32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt32ToArray(
        94, this_._internal_unpacked_sint32().Get(i), target);
  }

  // repeated sint64 unpacked_sint64 = 95 [features = {
  for (int i = 0, n = this_._internal_unpacked_sint64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt64ToArray(
        95, this_._internal_unpacked_sint64().Get(i), target);
  }

  // repeated fixed32 unpacked_fixed32 = 96 [features = {
  for (int i = 0, n = this_._internal_unpacked_fixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        96, this_._internal_unpacked_fixed32().Get(i), target);
  }

  // repeated fixed64 unpacked_fixed64 = 97 [features = {
  for (int i = 0, n = this_._internal_unpacked_fixed64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed64ToArray(
        97, this_._internal_unpacked_fixed64().Get(i), target);
  }

  // repeated sfixed32 unpacked_sfixed32 = 98 [features = {
  for (int i = 0, n = this_._internal_unpacked_sfixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed32ToArray(
        98, this_._internal_unpacked_sfixed32().Get(i), target);
  }

  // repeated sfixed64 unpacked_sfixed64 = 99 [features = {
  for (int i = 0, n = this_._internal_unpacked_sfixed64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed64ToArray(
        99, this_._internal_unpacked_sfixed64().Get(i), target);
  }

  // repeated float unpacked_float = 100 [features = {
  for (int i = 0, n = this_._internal_unpacked_float_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        100, this_._internal_unpacked_float().Get(i), target);
  }

  // repeated double unpacked_double = 101 [features = {
  for (int i = 0, n = this_._internal_unpacked_double_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteDoubleToArray(
        101, this_._internal_unpacked_double().Get(i), target);
  }

  // repeated bool unpacked_bool = 102 [features = {
  for (int i = 0, n = this_._internal_unpacked_bool_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        102, this_._internal_unpacked_bool().Get(i), target);
  }

  // repeated .edition_unittest.ForeignEnum unpacked_enum = 103 [features = {
  for (int i = 0, n = this_._internal_unpacked_enum_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        103, static_cast<::edition_unittest::ForeignEnum>(this_._internal_unpacked_enum().Get(i)),
        target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestUnpackedTypes)
  return target;
}